

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O0

void __thiscall xercesc_4_0::Match::initialize(Match *this,Match *toCopy)

{
  int n;
  int iVar1;
  int local_20;
  int i;
  int toCopySize;
  Match *toCopy_local;
  Match *this_local;
  
  this->fMemoryManager = toCopy->fMemoryManager;
  n = getNoGroups(toCopy);
  setNoGroups(this,n);
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    iVar1 = getStartPos(toCopy,local_20);
    setStartPos(this,local_20,iVar1);
    iVar1 = getEndPos(toCopy,local_20);
    setEndPos(this,local_20,iVar1);
  }
  return;
}

Assistant:

void Match::initialize(const Match &toCopy){

  //do not copy over value of fPositionSize as it is irrelevant to the 
  //state of the Match

  fMemoryManager = toCopy.fMemoryManager;
  int toCopySize = toCopy.getNoGroups();
  setNoGroups(toCopySize);

  for (int i=0; i<toCopySize; i++){
    setStartPos(i, toCopy.getStartPos(i));
    setEndPos(i, toCopy.getEndPos(i));
  }           

}